

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O2

Query * inline_suboperations(Query *__return_storage_ptr__,Query *q,bool *changed)

{
  QueryType QVar1;
  pointer pQVar2;
  pointer pQVar3;
  QueryType *pQVar4;
  vector<Query,_std::allocator<Query>_> *pvVar5;
  Query *subquery;
  pointer __args;
  Query *query;
  pointer this;
  vector<Query,_std::allocator<Query>_> newqueries;
  vector<Query,_std::allocator<Query>_> local_98;
  bool *local_80;
  Query local_78;
  
  local_80 = changed;
  pQVar4 = Query::get_type(q);
  if ((*pQVar4 != AND) && (pQVar4 = Query::get_type(q), *pQVar4 != OR)) {
    Query::Query(__return_storage_ptr__,q);
    return __return_storage_ptr__;
  }
  local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pvVar5 = Query::as_queries(q);
  pQVar2 = (pvVar5->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this = (pvVar5->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
              super__Vector_impl_data._M_start; this != pQVar2; this = this + 1) {
    pQVar4 = Query::get_type(this);
    QVar1 = *pQVar4;
    pQVar4 = Query::get_type(q);
    if (QVar1 == *pQVar4) {
      pvVar5 = Query::as_queries(this);
      pQVar3 = (pvVar5->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (__args = (pvVar5->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
                    super__Vector_impl_data._M_start; __args != pQVar3; __args = __args + 1) {
        std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>(&local_98,__args);
      }
      *local_80 = true;
    }
    else {
      std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>(&local_98,this);
    }
  }
  pQVar4 = Query::get_type(q);
  Query::Query(&local_78,pQVar4,&local_98);
  Query::Query(__return_storage_ptr__,&local_78);
  Query::~Query(&local_78);
  std::vector<Query,_std::allocator<Query>_>::~vector(&local_98);
  return __return_storage_ptr__;
}

Assistant:

Query inline_suboperations(Query &&q, bool *changed) {
    if (q.get_type() != QueryType::AND && q.get_type() != QueryType::OR) {
        return std::move(q);
    }
    std::vector<Query> newqueries;
    for (auto &&query : q.as_queries()) {
        if (query.get_type() == q.get_type()) {
            for (auto &&subquery : query.as_queries()) {
                newqueries.emplace_back(std::move(subquery));
            }
            *changed = true;
        } else {
            newqueries.emplace_back(std::move(query));
        }
    }
    return std::move(Query(q.get_type(), std::move(newqueries)));
}